

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_sectors.cpp
# Opt level: O1

sector_t_conflict * __thiscall sector_t::GetHeightSec(sector_t *this)

{
  sector_t_conflict *psVar1;
  extsector_t *peVar2;
  ulong uVar3;
  ulong uVar4;
  
  psVar1 = (sector_t_conflict *)this->heightsec;
  if ((psVar1 != (sector_t_conflict *)0x0) && ((psVar1->MoreFlags & 0x10) == 0)) {
    peVar2 = this->e;
    if (peVar2 == (extsector_t *)0x0) {
      return psVar1;
    }
    uVar3 = (ulong)(peVar2->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count;
    if (uVar3 == 0) {
      return psVar1;
    }
    do {
      uVar4 = uVar3;
      if (uVar4 == 0) {
        return psVar1;
      }
      uVar3 = uVar4 - 1;
    } while ((~(peVar2->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Array[uVar4 - 1]->flags
             & 9) != 0);
    if (uVar4 == 0) {
      return psVar1;
    }
  }
  return (sector_t_conflict *)0x0;
}

Assistant:

sector_t *sector_t::GetHeightSec() const 
{
	if (heightsec == NULL)
	{
		return NULL;
	}
	if (heightsec->MoreFlags & SECF_IGNOREHEIGHTSEC)
	{
		return NULL;
	}
	if (e && e->XFloor.ffloors.Size())
	{
		// If any of these fake floors render their planes, ignore heightsec.
		for (unsigned i = e->XFloor.ffloors.Size(); i-- > 0; )
		{
			if ((e->XFloor.ffloors[i]->flags & (FF_EXISTS | FF_RENDERPLANES)) == (FF_EXISTS | FF_RENDERPLANES))
			{
				return NULL;
			}
		}
	}
	return heightsec;
}